

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_sockfd.c
# Opt level: O0

int sfd_get_peer_uid(void *arg,void *buf,size_t *szp,nni_type t)

{
  int local_44;
  int local_40;
  int id;
  int ignore;
  int rv;
  nni_sfd_conn *c;
  size_t *psStack_28;
  nni_type t_local;
  size_t *szp_local;
  void *buf_local;
  void *arg_local;
  
  local_44 = 0;
  _ignore = arg;
  c._4_4_ = t;
  psStack_28 = szp;
  szp_local = (size_t *)buf;
  buf_local = arg;
  id = nni_posix_peerid(*(int *)((long)arg + 0x70),&local_44,&local_40,&local_40,&local_40);
  arg_local._4_4_ = id;
  if (id == 0) {
    arg_local._4_4_ = nni_copyout_int(local_44,szp_local,psStack_28,c._4_4_);
  }
  return arg_local._4_4_;
}

Assistant:

static int
sfd_get_peer_uid(void *arg, void *buf, size_t *szp, nni_type t)
{
	nni_sfd_conn *c = arg;
	int           rv;
	int           ignore;
	int           id = 0;

	rv = nni_posix_peerid(c->fd, &id, &ignore, &ignore, &ignore);
	if (rv != 0) {
		return (rv);
	}
	return (nni_copyout_int(id, buf, szp, t));
}